

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::java::ImmutableMessageGenerator::GenerateAnyMethods
          (ImmutableMessageGenerator *this,Printer *printer)

{
  string_view text;
  string_view text_00;
  string_view text_01;
  
  text._M_str = 
  "private static String getTypeUrl(\n    java.lang.String typeUrlPrefix,\n    com.google.protobuf.Descriptors.Descriptor descriptor) {\n  return typeUrlPrefix.endsWith(\"/\")\n      ? typeUrlPrefix + descriptor.getFullName()\n      : typeUrlPrefix + \"/\" + descriptor.getFullName();\n}\n\nprivate static String getTypeNameFromTypeUrl(\n    java.lang.String typeUrl) {\n  int pos = typeUrl.lastIndexOf(\'/\');\n  return pos == -1 ? \"\" : typeUrl.substring(pos + 1);\n}\n\npublic static <T extends com.google.protobuf.Message> Any pack(\n    T message) {\n  return Any.newBuilder()\n      .setTypeUrl(getTypeUrl(\"type.googleapis.com\",\n                             message.getDescriptorForType()))\n      .setValue(message.toByteString())\n      .build();\n}\n\n/**\n * Packs a message using the given type URL prefix. The type URL will\n * be constructed by concatenating the message type\'s full name to the\n * prefix with an optional \"/\" separator if the prefix doesn\'t end\n * with \"/\" already.\n */\npublic static <T extends com.google.protobuf.Message> Any pack(\n    T message, java.lang.String typeUrlPrefix) {\n  return Any.newBuilder()\n      .setTypeUrl(getTypeUrl(typeUrlPrefix,\n                             message.getDescriptorForType()))\n      .setValue(message.toByteString())\n      .build();\n}\n\npublic <T extends com.google.protobuf.Message> boolean is(\n    java.lang.Class<T> clazz) {\n  T defaultInstance =\n      com.google.protobuf.Internal.getDefaultInstance(clazz);\n  return getTypeNameFromTypeUrl(getTypeUrl()).equals(\n      defaultInstance.getDescriptorForType().getFullName());\n}\n\npublic boolean isSameTypeAs(com.google.protobuf.Message message) {\n  return getTypeNameFromTypeUrl(getTypeUrl()).equals(\n      message.getDescriptorForType().getFullName());\n}\n\n@SuppressWarnings(\"serial\")\nprivate volatile com.google.protobuf.Message cachedUnpackValue;\n\n@java.lang.SuppressWarnings(\"unchecked\")\npublic <T extends com.google.protobuf.Message> T unpack(\n    java.lang.Class<T> clazz)\n    throws com.google.protobuf.InvalidProtocolBufferException {\n"
  ;
  text._M_len = 0x7e9;
  io::Printer::Print<>(printer,text);
  text_00._M_str =
       "  boolean invalidClazz = false;\n  if (cachedUnpackValue != null) {\n    if (cachedUnpackValue.getClass() == clazz) {\n      return (T) cachedUnpackValue;\n    }\n    invalidClazz = true;\n  }\n  if (invalidClazz || !is(clazz)) {\n    throw new com.google.protobuf.InvalidProtocolBufferException(\n        \"Type of the Any message does not match the given class.\");\n  }\n  T defaultInstance =\n      com.google.protobuf.Internal.getDefaultInstance(clazz);\n  T result = (T) defaultInstance.getParserForType()\n      .parseFrom(getValue());\n  cachedUnpackValue = result;\n  return result;\n}\n\n@java.lang.SuppressWarnings(\"unchecked\")\npublic <T extends com.google.protobuf.Message> T unpackSameTypeAs(T message)\n    throws com.google.protobuf.InvalidProtocolBufferException {\n"
  ;
  text_00._M_len = 0x2f7;
  io::Printer::Print<>(printer,text_00);
  text_01._M_str =
       "  boolean invalidValue = false;\n  if (cachedUnpackValue != null) {\n    if (cachedUnpackValue.getClass() == message.getClass()) {\n      return (T) cachedUnpackValue;\n    }\n    invalidValue = true;\n  }\n  if (invalidValue || !isSameTypeAs(message)) {\n    throw new com.google.protobuf.InvalidProtocolBufferException(\n        \"Type of the Any message does not match the given exemplar.\");\n  }\n  T result = (T) message.getParserForType().parseFrom(getValue());\n  cachedUnpackValue = result;\n  return result;\n}\n\n"
  ;
  text_01._M_len = 0x1fa;
  io::Printer::Print<>(printer,text_01);
  return;
}

Assistant:

void ImmutableMessageGenerator::GenerateAnyMethods(io::Printer* printer) {
  printer->Print(
      "private static String getTypeUrl(\n"
      "    java.lang.String typeUrlPrefix,\n"
      "    com.google.protobuf.Descriptors.Descriptor descriptor) {\n"
      "  return typeUrlPrefix.endsWith(\"/\")\n"
      "      ? typeUrlPrefix + descriptor.getFullName()\n"
      "      : typeUrlPrefix + \"/\" + descriptor.getFullName();\n"
      "}\n"
      "\n"
      "private static String getTypeNameFromTypeUrl(\n"
      "    java.lang.String typeUrl) {\n"
      "  int pos = typeUrl.lastIndexOf('/');\n"
      "  return pos == -1 ? \"\" : typeUrl.substring(pos + 1);\n"
      "}\n"
      "\n"
      "public static <T extends com.google.protobuf.Message> Any pack(\n"
      "    T message) {\n"
      "  return Any.newBuilder()\n"
      "      .setTypeUrl(getTypeUrl(\"type.googleapis.com\",\n"
      "                             message.getDescriptorForType()))\n"
      "      .setValue(message.toByteString())\n"
      "      .build();\n"
      "}\n"
      "\n"
      "/**\n"
      " * Packs a message using the given type URL prefix. The type URL will\n"
      " * be constructed by concatenating the message type's full name to the\n"
      " * prefix with an optional \"/\" separator if the prefix doesn't end\n"
      " * with \"/\" already.\n"
      " */\n"
      "public static <T extends com.google.protobuf.Message> Any pack(\n"
      "    T message, java.lang.String typeUrlPrefix) {\n"
      "  return Any.newBuilder()\n"
      "      .setTypeUrl(getTypeUrl(typeUrlPrefix,\n"
      "                             message.getDescriptorForType()))\n"
      "      .setValue(message.toByteString())\n"
      "      .build();\n"
      "}\n"
      "\n"
      "public <T extends com.google.protobuf.Message> boolean is(\n"
      "    java.lang.Class<T> clazz) {\n"
      "  T defaultInstance =\n"
      "      com.google.protobuf.Internal.getDefaultInstance(clazz);\n"
      "  return getTypeNameFromTypeUrl(getTypeUrl()).equals(\n"
      "      defaultInstance.getDescriptorForType().getFullName());\n"
      "}\n"
      "\n"
      "public boolean isSameTypeAs(com.google.protobuf.Message message) {\n"
      "  return getTypeNameFromTypeUrl(getTypeUrl()).equals(\n"
      "      message.getDescriptorForType().getFullName());\n"
      "}\n"
      "\n"
      "@SuppressWarnings(\"serial\")\n"
      "private volatile com.google.protobuf.Message cachedUnpackValue;\n"
      "\n"
      "@java.lang.SuppressWarnings(\"unchecked\")\n"
      "public <T extends com.google.protobuf.Message> T unpack(\n"
      "    java.lang.Class<T> clazz)\n"
      "    throws com.google.protobuf.InvalidProtocolBufferException {\n");
  printer->Print(
      "  boolean invalidClazz = false;\n"
      "  if (cachedUnpackValue != null) {\n"
      "    if (cachedUnpackValue.getClass() == clazz) {\n"
      "      return (T) cachedUnpackValue;\n"
      "    }\n"
      "    invalidClazz = true;\n"
      "  }\n"
      "  if (invalidClazz || !is(clazz)) {\n"
      "    throw new com.google.protobuf.InvalidProtocolBufferException(\n"
      "        \"Type of the Any message does not match the given class.\");\n"
      "  }\n"
      "  T defaultInstance =\n"
      "      com.google.protobuf.Internal.getDefaultInstance(clazz);\n"
      "  T result = (T) defaultInstance.getParserForType()\n"
      "      .parseFrom(getValue());\n"
      "  cachedUnpackValue = result;\n"
      "  return result;\n"
      "}\n"
      "\n"
      "@java.lang.SuppressWarnings(\"unchecked\")\n"
      "public <T extends com.google.protobuf.Message> T unpackSameTypeAs("
      "T message)\n"
      "    throws com.google.protobuf.InvalidProtocolBufferException {\n");
  printer->Print(
      "  boolean invalidValue = false;\n"
      "  if (cachedUnpackValue != null) {\n"
      "    if (cachedUnpackValue.getClass() == message.getClass()) {\n"
      "      return (T) cachedUnpackValue;\n"
      "    }\n"
      "    invalidValue = true;\n"
      "  }\n"
      "  if (invalidValue || !isSameTypeAs(message)) {\n"
      "    throw new com.google.protobuf.InvalidProtocolBufferException(\n"
      "        \"Type of the Any message does not match the given "
      "exemplar.\");\n"
      "  }\n"
      "  T result = (T) message.getParserForType().parseFrom(getValue());\n"
      "  cachedUnpackValue = result;\n"
      "  return result;\n"
      "}\n"
      "\n");
}